

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O3

int nk_do_selectable_image
              (nk_flags *state,nk_command_buffer *out,nk_rect bounds,char *str,int len,
              nk_flags align,int *value,nk_image *img,nk_style_selectable *style,nk_input *in,
              nk_user_font *font)

{
  int iVar1;
  int iVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  nk_rect r;
  nk_rect local_50;
  nk_rect bounds_local;
  
  fVar4 = bounds.x;
  bounds_local = bounds;
  if (state == (nk_flags *)0x0) {
    __assert_fail("state",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/deps/nuklear.h"
                  ,0x5127,
                  "int nk_do_selectable_image(nk_flags *, struct nk_command_buffer *, struct nk_rect, const char *, int, nk_flags, int *, const struct nk_image *, const struct nk_style_selectable *, const struct nk_input *, const struct nk_user_font *)"
                 );
  }
  if (out == (nk_command_buffer *)0x0) {
    __assert_fail("out",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/deps/nuklear.h"
                  ,0x5128,
                  "int nk_do_selectable_image(nk_flags *, struct nk_command_buffer *, struct nk_rect, const char *, int, nk_flags, int *, const struct nk_image *, const struct nk_style_selectable *, const struct nk_input *, const struct nk_user_font *)"
                 );
  }
  if (str == (char *)0x0) {
    __assert_fail("str",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/deps/nuklear.h"
                  ,0x5129,
                  "int nk_do_selectable_image(nk_flags *, struct nk_command_buffer *, struct nk_rect, const char *, int, nk_flags, int *, const struct nk_image *, const struct nk_style_selectable *, const struct nk_input *, const struct nk_user_font *)"
                 );
  }
  if (len != 0) {
    if (value == (int *)0x0) {
      __assert_fail("value",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/deps/nuklear.h"
                    ,0x512b,
                    "int nk_do_selectable_image(nk_flags *, struct nk_command_buffer *, struct nk_rect, const char *, int, nk_flags, int *, const struct nk_image *, const struct nk_style_selectable *, const struct nk_input *, const struct nk_user_font *)"
                   );
    }
    if (style != (nk_style_selectable *)0x0) {
      if (font != (nk_user_font *)0x0) {
        iVar1 = *value;
        fVar3 = (style->touch_padding).x;
        fVar5 = (style->touch_padding).y;
        r.x = fVar4 - fVar3;
        r.y = bounds.y - fVar5;
        r.w = fVar3 + fVar3 + bounds.w;
        r.h = fVar5 + fVar5 + bounds.h;
        iVar2 = nk_button_behavior(state,r,in,NK_BUTTON_DEFAULT);
        if (iVar2 != 0) {
          *value = (uint)(*value == 0);
        }
        fVar3 = (style->padding).y;
        local_50.h = bounds.h - (fVar3 + fVar3);
        if ((align & 1) == 0) {
          fVar5 = (style->padding).x;
          local_50.x = fVar5 + fVar5 + fVar4;
        }
        else {
          fVar5 = (style->padding).x;
          fVar4 = (fVar4 + bounds.w) - (fVar5 + fVar5 + local_50.h);
          local_50.x = 0.0;
          if (0.0 <= fVar4) {
            local_50.x = fVar4;
          }
        }
        fVar4 = (style->image_padding).x;
        fVar5 = (style->image_padding).y;
        local_50.x = local_50.x + fVar4;
        local_50.y = bounds.y + fVar3 + fVar5;
        local_50.w = local_50.h - (fVar4 + fVar4);
        local_50.h = local_50.h - (fVar5 + fVar5);
        if (style->draw_begin != (_func_void_nk_command_buffer_ptr_nk_handle *)0x0) {
          (*style->draw_begin)(out,(nk_handle)(style->userdata).ptr);
        }
        nk_draw_selectable(out,*state,style,*value,&bounds_local,&local_50,img,NK_SYMBOL_NONE,str,
                           len,align,font);
        if (style->draw_end != (_func_void_nk_command_buffer_ptr_nk_handle *)0x0) {
          (*style->draw_end)(out,(nk_handle)(style->userdata).ptr);
        }
        return (int)(iVar1 != *value);
      }
      __assert_fail("font",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/deps/nuklear.h"
                    ,0x512d,
                    "int nk_do_selectable_image(nk_flags *, struct nk_command_buffer *, struct nk_rect, const char *, int, nk_flags, int *, const struct nk_image *, const struct nk_style_selectable *, const struct nk_input *, const struct nk_user_font *)"
                   );
    }
    __assert_fail("style",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/deps/nuklear.h"
                  ,0x512c,
                  "int nk_do_selectable_image(nk_flags *, struct nk_command_buffer *, struct nk_rect, const char *, int, nk_flags, int *, const struct nk_image *, const struct nk_style_selectable *, const struct nk_input *, const struct nk_user_font *)"
                 );
  }
  __assert_fail("len",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/deps/nuklear.h"
                ,0x512a,
                "int nk_do_selectable_image(nk_flags *, struct nk_command_buffer *, struct nk_rect, const char *, int, nk_flags, int *, const struct nk_image *, const struct nk_style_selectable *, const struct nk_input *, const struct nk_user_font *)"
               );
}

Assistant:

NK_LIB int
nk_do_selectable_image(nk_flags *state, struct nk_command_buffer *out,
    struct nk_rect bounds, const char *str, int len, nk_flags align, int *value,
    const struct nk_image *img, const struct nk_style_selectable *style,
    const struct nk_input *in, const struct nk_user_font *font)
{
    int old_value;
    struct nk_rect touch;
    struct nk_rect icon;

    NK_ASSERT(state);
    NK_ASSERT(out);
    NK_ASSERT(str);
    NK_ASSERT(len);
    NK_ASSERT(value);
    NK_ASSERT(style);
    NK_ASSERT(font);

    if (!state || !out || !str || !len || !value || !style || !font) return 0;
    old_value = *value;

    /* toggle behavior */
    touch.x = bounds.x - style->touch_padding.x;
    touch.y = bounds.y - style->touch_padding.y;
    touch.w = bounds.w + style->touch_padding.x * 2;
    touch.h = bounds.h + style->touch_padding.y * 2;
    if (nk_button_behavior(state, touch, in, NK_BUTTON_DEFAULT))
        *value = !(*value);

    icon.y = bounds.y + style->padding.y;
    icon.w = icon.h = bounds.h - 2 * style->padding.y;
    if (align & NK_TEXT_ALIGN_LEFT) {
        icon.x = (bounds.x + bounds.w) - (2 * style->padding.x + icon.w);
        icon.x = NK_MAX(icon.x, 0);
    } else icon.x = bounds.x + 2 * style->padding.x;

    icon.x += style->image_padding.x;
    icon.y += style->image_padding.y;
    icon.w -= 2 * style->image_padding.x;
    icon.h -= 2 * style->image_padding.y;

    /* draw selectable */
    if (style->draw_begin) style->draw_begin(out, style->userdata);
    nk_draw_selectable(out, *state, style, *value, &bounds, &icon, img, NK_SYMBOL_NONE, str, len, align, font);
    if (style->draw_end) style->draw_end(out, style->userdata);
    return old_value != *value;
}